

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_>::dispose
          (Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *this)

{
  WeakFulfiller<capnp::AnyPointer::Pipeline> *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (WeakFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    this->ptr = (WeakFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
    Disposer::Dispose_<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>,_true>::dispose
              ((Dispose_<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>,_true> *)this_00,
               (WeakFulfiller<capnp::AnyPointer::Pipeline> *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }